

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

FIOBJ http_mimetype_find(char *file_ext,size_t file_ext_len)

{
  fio_mime_set_s *set;
  fio_mime_set__map_s_ *pfVar1;
  FIOBJ FVar2;
  FIOBJ obj;
  
  FVar2 = 0;
  set = (fio_mime_set_s *)fio_siphash13(file_ext,file_ext_len,0,0);
  pfVar1 = fio_mime_set__find_map_pos_(set,file_ext_len,obj);
  if (pfVar1 != (fio_mime_set__map_s_ *)0x0) {
    if (pfVar1->pos == (fio_mime_set__ordered_s_ *)0x0) {
      FVar2 = 0;
    }
    else {
      FVar2 = pfVar1->pos->obj;
    }
  }
  FVar2 = fiobj_dup(FVar2);
  return FVar2;
}

Assistant:

FIOBJ http_mimetype_find(char *file_ext, size_t file_ext_len) {
  uintptr_t hash = FIO_HASH_FN(file_ext, file_ext_len, 0, 0);
  return fiobj_dup(
      fio_mime_set_find(&fio_http_mime_types, hash, FIOBJ_INVALID));
}